

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::EndObject(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
            *this,SizeType memberCount)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (this->valid_ == true) {
    pcVar3 = (this->schemaStack_).stack_;
    pcVar2 = (this->schemaStack_).stackTop_;
    if (pcVar3 != pcVar2) {
      do {
        if (*(Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)(pcVar3 + 0x38) !=
            (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x0) {
          internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EndObject
                    (*(Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)(pcVar3 + 0x38),
                     memberCount);
        }
        if ((*(long *)(pcVar3 + 0x48) != 0) && (*(int *)(pcVar3 + 0x50) != 0)) {
          uVar4 = 0;
          do {
            EndObject((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                       *)(*(long *)(*(long *)(pcVar3 + 0x48) + uVar4 * 8) + -8),memberCount);
            uVar4 = uVar4 + 1;
          } while (uVar4 < *(uint *)(pcVar3 + 0x50));
        }
        if ((*(long *)(pcVar3 + 0x58) != 0) && (*(int *)(pcVar3 + 0x60) != 0)) {
          uVar4 = 0;
          do {
            EndObject((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                       *)(*(long *)(*(long *)(pcVar3 + 0x58) + uVar4 * 8) + -8),memberCount);
            uVar4 = uVar4 + 1;
          } while (uVar4 < *(uint *)(pcVar3 + 0x60));
        }
        pcVar3 = pcVar3 + 0x90;
        pcVar2 = (this->schemaStack_).stackTop_;
      } while (pcVar3 != pcVar2);
      pcVar3 = (this->schemaStack_).stack_;
    }
    if ((ulong)((long)pcVar2 - (long)pcVar3) < 0x90) {
      __assert_fail("GetSize() >= sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x98,
                    "const T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() const [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>]"
                   );
    }
    bVar1 = internal::
            Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            ::EndObject(*(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                          **)(pcVar2 + -0x80),(Context *)(pcVar2 + -0x90),memberCount);
    if ((bVar1) || (bVar1 = false, (this->flags_ & 1) != 0)) {
      bVar1 = EndValue(this);
      if ((bVar1) || ((this->flags_ & 1) != 0)) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    this->valid_ = bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool EndObject(SizeType memberCount) {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::EndObject");
        if (!valid_) return false;
        RAPIDJSON_SCHEMA_HANDLE_PARALLEL_(EndObject, (memberCount));
        if (!CurrentSchema().EndObject(CurrentContext(), memberCount) && !GetContinueOnErrors()) { 
            valid_ = false; 
            return valid_; 
        }
        RAPIDJSON_SCHEMA_HANDLE_END_(EndObject, (memberCount));
    }